

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildbench_device.cpp
# Opt level: O0

void embree::convertSubdivMesh(ISPCSubdivMesh *mesh,RTCScene scene_out,RTCBuildQuality quality)

{
  undefined8 uVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t t;
  size_t i;
  RTCGeometry geom;
  undefined8 local_30;
  undefined8 local_28;
  
  uVar1 = rtcNewGeometry(g_device,8);
  rtcSetGeometryTimeStepCount(uVar1,*(undefined4 *)(in_RDI + 0xa0));
  rtcSetGeometryBuildQuality(uVar1,in_EDX);
  for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0xac); local_28 = local_28 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x68) + local_28 * 4) = 0x41800000;
  }
  for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0xa0); local_30 = local_30 + 1) {
    rtcSetSharedGeometryBuffer
              (uVar1,1,local_30 & 0xffffffff,0x9003,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + local_30 * 8),0,0x10,
               *(undefined4 *)(in_RDI + 0xa4));
  }
  rtcSetSharedGeometryBuffer
            (uVar1,0x11,0,0x9001,*(undefined8 *)(in_RDI + 0x68),0,4,*(undefined4 *)(in_RDI + 0xac));
  rtcSetSharedGeometryBuffer
            (uVar1,0,0,0x5001,*(undefined8 *)(in_RDI + 0x30),0,4,*(undefined4 *)(in_RDI + 0xac));
  rtcSetSharedGeometryBuffer
            (uVar1,0x10,0,0x5001,*(undefined8 *)(in_RDI + 0x58),0,4,*(undefined4 *)(in_RDI + 0xa8));
  rtcSetSharedGeometryBuffer
            (uVar1,0x16,0,0x5001,*(undefined8 *)(in_RDI + 0x60),0,4,*(undefined4 *)(in_RDI + 0xb8));
  rtcSetSharedGeometryBuffer
            (uVar1,0x12,0,0x5002,*(undefined8 *)(in_RDI + 0x70),0,8,*(undefined4 *)(in_RDI + 0xb0));
  rtcSetSharedGeometryBuffer
            (uVar1,0x13,0,0x9001,*(undefined8 *)(in_RDI + 0x78),0,4,*(undefined4 *)(in_RDI + 0xb0));
  rtcSetSharedGeometryBuffer
            (uVar1,0x14,0,0x5001,*(undefined8 *)(in_RDI + 0x80),0,4,*(undefined4 *)(in_RDI + 0xb4));
  rtcSetSharedGeometryBuffer
            (uVar1,0x15,0,0x9001,*(undefined8 *)(in_RDI + 0x88),0,4,*(undefined4 *)(in_RDI + 0xb4));
  rtcSetGeometrySubdivisionMode(uVar1,0,*(undefined4 *)(in_RDI + 0x48));
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(in_RSI,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void convertSubdivMesh(ISPCSubdivMesh* mesh, RTCScene scene_out, RTCBuildQuality quality)
  {
    RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_SUBDIVISION);
    rtcSetGeometryTimeStepCount(geom, mesh->numTimeSteps);
    rtcSetGeometryBuildQuality(geom, quality);
    for (size_t i=0; i<mesh->numEdges; i++) mesh->subdivlevel[i] = 16.0f;
    for (size_t t=0; t<mesh->numTimeSteps; t++) {
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, (unsigned int)t, RTC_FORMAT_FLOAT3, mesh->positions[t], 0, sizeof(Vec3fa), mesh->numVertices);
    }
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_LEVEL, 0, RTC_FORMAT_FLOAT, mesh->subdivlevel,      0, sizeof(float),        mesh->numEdges);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT,  mesh->position_indices, 0, sizeof(unsigned int), mesh->numEdges);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,  0, RTC_FORMAT_UINT,  mesh->verticesPerFace,  0, sizeof(unsigned int), mesh->numFaces);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_HOLE,  0, RTC_FORMAT_UINT,  mesh->holes,            0, sizeof(unsigned int), mesh->numHoles);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_INDEX,    0, RTC_FORMAT_UINT2, mesh->edge_creases,          0, 2*sizeof(unsigned int), mesh->numEdgeCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT,   0, RTC_FORMAT_FLOAT, mesh->edge_crease_weights,   0, sizeof(float),          mesh->numEdgeCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX,  0, RTC_FORMAT_UINT,  mesh->vertex_creases,        0, sizeof(unsigned int),   mesh->numVertexCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT, 0, RTC_FORMAT_FLOAT, mesh->vertex_crease_weights, 0, sizeof(float),          mesh->numVertexCreases);
    rtcSetGeometrySubdivisionMode(geom, 0, mesh->position_subdiv_mode);
    rtcCommitGeometry(geom);
    rtcAttachGeometry(scene_out,geom);
    rtcReleaseGeometry(geom);
  }